

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AttributeSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::AttributeSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::Symbol_const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,Symbol *args_2,ExpressionSyntax *args_3)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  AttributeSymbol *pAVar4;
  
  pAVar4 = (AttributeSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AttributeSymbol *)this->endPtr < pAVar4 + 1) {
    pAVar4 = (AttributeSymbol *)allocateSlow(this,0x70,8);
  }
  else {
    this->head->current = (byte *)(pAVar4 + 1);
  }
  sVar2 = args->_M_len;
  pcVar3 = args->_M_str;
  SVar1 = *args_1;
  (pAVar4->super_Symbol).kind = Attribute;
  (pAVar4->super_Symbol).name._M_len = sVar2;
  (pAVar4->super_Symbol).name._M_str = pcVar3;
  (pAVar4->super_Symbol).location = SVar1;
  (pAVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pAVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pAVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pAVar4->super_Symbol).indexInScope = 0;
  pAVar4->symbol = args_2;
  pAVar4->scope = (Scope *)0x0;
  pAVar4->expr = args_3;
  pAVar4->value = (ConstantValue *)0x0;
  (pAVar4->lookupLocation).scope = (Scope *)0x0;
  (pAVar4->lookupLocation).index = 0;
  return pAVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }